

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::SetItemWithAttributes
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr,DynamicObject *instance,uint32 index,
          Var value,PropertyAttributes attributes)

{
  Var aValue;
  IndexPropertyDescriptorMap *this_00;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *function;
  undefined3 in_register_00000089;
  PropertyAttributes attributes_00;
  uint uVar5;
  IndexPropertyDescriptor local_60;
  IndexPropertyDescriptor *local_48;
  IndexPropertyDescriptor *descriptor;
  uint local_34;
  
  if ((this->lengthWritable == false) &&
     ((arr->super_JavascriptArray).super_ArrayObject.length <= index)) {
    return 0;
  }
  descriptor = (IndexPropertyDescriptor *)value;
  bVar2 = DynamicObject::GetHasNoEnumerableProperties((DynamicObject *)arr);
  uVar5 = CONCAT31(in_register_00000089,attributes);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    local_34 = CONCAT31(in_register_00000089,attributes);
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                ,0x1e8,"(!arr->GetHasNoEnumerableProperties())",
                                "!arr->GetHasNoEnumerableProperties()");
    if (!bVar2) goto LAB_00c43be4;
    *puVar4 = 0;
    uVar5 = local_34;
  }
  if (((uVar5 & 4) == 0) &&
     (DynamicTypeHandler::ClearHasOnlyWritableDataProperties((DynamicTypeHandler *)this),
     ((this->super_DictionaryTypeHandlerBase<int>).super_DynamicTypeHandler.flags & 0x20) != 0)) {
    local_34 = uVar5;
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
    WriteBarrierSet((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
                    &local_60,
                    &((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                     typesWithOnlyWritablePropertyProtoChain);
    uVar5 = local_34;
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
              ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)local_60._0_8_);
  }
  bVar2 = IndexPropertyDescriptorMap::TryGetReference((this->indexPropertyMap).ptr,index,&local_48);
  attributes_00 = (PropertyAttributes)uVar5;
  if (bVar2) {
    if ((local_48->Attributes & 8) == 0) {
      local_48->Attributes = attributes_00;
      BVar3 = HasDataItem(this,arr,index);
      if (BVar3 == 0) {
        aValue = (local_48->Setter).ptr;
        if (aValue == (Var)0x0) {
          return 1;
        }
        function = VarTo<Js::RecyclableObject>(aValue);
        JavascriptOperators::CallSetter(function,instance,descriptor,(ScriptContext *)0x0);
        return 1;
      }
    }
    else {
      if (((local_48->Getter).ptr != (void *)0x0) || ((local_48->Setter).ptr != (void *)0x0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                    ,0x1f8,"(!descriptor->Getter && !descriptor->Setter)",
                                    "!descriptor->Getter && !descriptor->Setter");
        if (!bVar2) goto LAB_00c43be4;
        *puVar4 = 0;
      }
      local_48->Attributes = attributes_00;
    }
    JavascriptArray::DirectSetItemAt<void*>(&arr->super_JavascriptArray,index,descriptor);
  }
  else {
    bVar2 = DynamicObject::GetHasNoEnumerableProperties((DynamicObject *)arr);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                  ,0x20e,"(!arr->GetHasNoEnumerableProperties())",
                                  "!arr->GetHasNoEnumerableProperties()");
      if (!bVar2) {
LAB_00c43be4:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    JavascriptArray::DirectSetItemAt<void*>(&arr->super_JavascriptArray,index,descriptor);
    this_00 = (this->indexPropertyMap).ptr;
    IndexPropertyDescriptor::IndexPropertyDescriptor(&local_60,attributes_00,(Var)0x0,(Var)0x0);
    IndexPropertyDescriptorMap::Add(this_00,index,&local_60);
  }
  return 1;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::SetItemWithAttributes(ES5Array* arr, DynamicObject* instance, uint32 index, Var value, PropertyAttributes attributes)
    {
        // Reject if we need to grow non-writable length
        if (!CanSetItemAt(arr, index))
        {
            return false;
        }

        // We don't track non-enumerable items in object array.  Objects with an object array
        // report having enumerable properties.  See DynamicObject::GetHasNoEnumerableProperties.
        // Array objects (which don't have an object array, and could report their hasNoEnumerableProperties
        // directly) take an explicit type transition before switching to ES5ArrayTypeHandler, so their
        // hasNoEnumerableProperties flag gets cleared.
        Assert(!arr->GetHasNoEnumerableProperties());

        if (!(attributes & PropertyWritable))
        {
            this->ClearHasOnlyWritableDataProperties();
            if(this->GetFlags() & this->IsPrototypeFlag)
            {
                instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
            }
        }

        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                Assert(!descriptor->Getter && !descriptor->Setter);
                descriptor->Attributes = attributes;
                arr->DirectSetItemAt(index, value);
                return true;
            }

            descriptor->Attributes = attributes;

            if (HasDataItem(arr, index))
            {
                arr->DirectSetItemAt(index, value);
            }
            else if (descriptor->Setter)
            {
                RecyclableObject* func = VarTo<RecyclableObject>(descriptor->Setter);
                // TODO : request context
                JavascriptOperators::CallSetter(func, instance, value, NULL);
            }
        }
        else
        {
            // See comment for the same assert above.
            Assert(!arr->GetHasNoEnumerableProperties());

            // Not found in attribute map
            arr->DirectSetItemAt(index, value);
            indexPropertyMap->Add(index, IndexPropertyDescriptor(attributes));
        }

        return true;
    }